

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.c
# Opt level: O0

void set_ext_overrides(AV1_COMMON *cm,EncodeFrameParams *frame_params,ExternalFlags *ext_flags)

{
  ExternalFlags *ext_flags_local;
  EncodeFrameParams *frame_params_local;
  AV1_COMMON *cm_local;
  
  if ((ext_flags->use_s_frame & 1U) != 0) {
    frame_params->frame_type = '\x03';
  }
  if ((ext_flags->refresh_frame_context_pending & 1U) != 0) {
    (cm->features).refresh_frame_context = ext_flags->refresh_frame_context & 1;
    ext_flags->refresh_frame_context_pending = false;
  }
  (cm->features).allow_ref_frame_mvs = (_Bool)(ext_flags->use_ref_frame_mvs & 1);
  frame_params->error_resilient_mode = (uint)(ext_flags->use_error_resilient & 1);
  frame_params->error_resilient_mode =
       (uint)(frame_params->frame_type != '\0') & frame_params->error_resilient_mode;
  frame_params->error_resilient_mode =
       (uint)(frame_params->frame_type == '\x03') | frame_params->error_resilient_mode;
  return;
}

Assistant:

static void set_ext_overrides(AV1_COMMON *const cm,
                              EncodeFrameParams *const frame_params,
                              ExternalFlags *const ext_flags) {
  // Overrides the defaults with the externally supplied values with
  // av1_update_reference() and av1_update_entropy() calls
  // Note: The overrides are valid only for the next frame passed
  // to av1_encode_lowlevel()

  if (ext_flags->use_s_frame) {
    frame_params->frame_type = S_FRAME;
  }

  if (ext_flags->refresh_frame_context_pending) {
    cm->features.refresh_frame_context = ext_flags->refresh_frame_context;
    ext_flags->refresh_frame_context_pending = 0;
  }
  cm->features.allow_ref_frame_mvs = ext_flags->use_ref_frame_mvs;

  frame_params->error_resilient_mode = ext_flags->use_error_resilient;
  // A keyframe is already error resilient and keyframes with
  // error_resilient_mode interferes with the use of show_existing_frame
  // when forward reference keyframes are enabled.
  frame_params->error_resilient_mode &= frame_params->frame_type != KEY_FRAME;
  // For bitstream conformance, s-frames must be error-resilient
  frame_params->error_resilient_mode |= frame_params->frame_type == S_FRAME;
}